

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O3

ON_UserData * __thiscall ON_Object::GetUserData(ON_Object *this,ON_UUID *userdata_uuid)

{
  bool bVar1;
  int iVar2;
  ON_UnknownUserData *this_00;
  ON_UserData *pOVar3;
  ON_UserData *pOVar4;
  ON_Object *pNotConst;
  ON_UserData *this_01;
  
  this_01 = this->m_userdata_list;
  if (this_01 == (ON_UserData *)0x0) {
    this_01 = (ON_UserData *)0x0;
  }
  else {
    iVar2 = ON_UuidCompare(&this_01->m_userdata_uuid,userdata_uuid);
    if (iVar2 == 0) {
      pOVar4 = (ON_UserData *)0x0;
    }
    else {
      do {
        pOVar4 = this_01;
        this_01 = pOVar4->m_userdata_next;
        if (this_01 == (ON_UserData *)0x0) {
          return (ON_UserData *)0x0;
        }
        iVar2 = ON_UuidCompare(&this_01->m_userdata_uuid,userdata_uuid);
      } while (iVar2 != 0);
    }
    bVar1 = ON_UserData::IsUnknownUserData(this_01);
    if (((bVar1) &&
        (this_00 = ON_UnknownUserData::Cast(&this_01->super_ON_Object),
        this_00 != (ON_UnknownUserData *)0x0)) &&
       (pOVar3 = ON_UnknownUserData::Convert(this_00), pOVar3 != (ON_UserData *)0x0)) {
      if (pOVar4 == (ON_UserData *)0x0) {
        if (this_01 == this->m_userdata_list) {
          this->m_userdata_list = pOVar3;
          pOVar3->m_userdata_owner = this;
        }
      }
      else {
        pOVar4->m_userdata_next = pOVar3;
      }
      pOVar3->m_userdata_next = this_01->m_userdata_next;
      this_01->m_userdata_owner = (ON_Object *)0x0;
      this_01->m_userdata_next = (ON_UserData *)0x0;
      (*(this_01->super_ON_Object)._vptr_ON_Object[4])(this_01);
      this_01 = pOVar3;
    }
  }
  return this_01;
}

Assistant:

ON_UserData* ON_Object::GetUserData( const ON_UUID& userdata_uuid ) const
 {
  ON_UserData* prev = nullptr;
  ON_UserData* p;
  for ( p = m_userdata_list; p; prev = p, p = p->m_userdata_next ) 
  {
    if ( !ON_UuidCompare( &p->m_userdata_uuid, &userdata_uuid ) ) 
    {
      if ( p->IsUnknownUserData() ) 
      {
        // See if we can convert this unknown user data into something useful.
        // Unknown user data is created when a 3dm archive is read and
        // the definition of the specific user data class is not loaded.
        // If something is getting around to asking for a specific kind
        // of user data, the class definition has probably be dynamically
        // loaded.
        ON_UnknownUserData* uud = ON_UnknownUserData::Cast(p);
        if ( uud ) {
          ON_UserData* realp = uud->Convert();
          if ( realp ) 
          {
            // replace unknown user data with the real thing
            if ( prev )
              prev->m_userdata_next = realp;
            else if ( p == m_userdata_list ) 
            {
              // little white lie to attach the "real" user
              // data to the object in place of the unknown
              // user data.
              ON_Object* pNotConst = const_cast<ON_Object*>(this);
              pNotConst->m_userdata_list = realp;
              realp->m_userdata_owner = pNotConst; // Dale Lear added 22 Jan 2004 to fix I/O bug 
            }
            realp->m_userdata_next = p->m_userdata_next;
            p->m_userdata_next = 0;
            p->m_userdata_owner = 0;
            delete p;
            p = realp;
          }
        }
      }
      break;
    }
  }
  return p; 
}